

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

LIBSSH2_CHANNEL * libssh2_channel_forward_accept(LIBSSH2_LISTENER *listener)

{
  int iVar1;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar2;
  int rc;
  time_t entry_time;
  LIBSSH2_CHANNEL *ptr;
  LIBSSH2_LISTENER *listener_local;
  
  if (listener != (LIBSSH2_LISTENER *)0x0) {
    start_time = time((time_t *)0x0);
    do {
      pLVar2 = channel_forward_accept(listener);
      if (listener->session->api_block_mode == 0) {
        return pLVar2;
      }
      if (pLVar2 != (LIBSSH2_CHANNEL *)0x0) {
        return pLVar2;
      }
      iVar1 = libssh2_session_last_errno(listener->session);
      if (iVar1 != -0x25) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
      iVar1 = _libssh2_wait_socket(listener->session,start_time);
    } while (iVar1 == 0);
  }
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_CHANNEL *
libssh2_channel_forward_accept(LIBSSH2_LISTENER *listener)
{
    LIBSSH2_CHANNEL *ptr;

    if(!listener)
        return NULL;

    BLOCK_ADJUST_ERRNO(ptr, listener->session,
                       channel_forward_accept(listener));
    return ptr;

}